

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::initializeTexture
          (SamplerBindingRenderCase *this,GLint bindingPoint,GLint textureName,Vec4 *color)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ConstPixelBufferAccess local_138;
  PixelBufferAccess local_110;
  TextureFormat local_e8;
  undefined1 local_e0 [8];
  TextureLevel level_1;
  PixelBufferAccess local_80;
  TextureFormat local_58;
  undefined1 local_50 [8];
  TextureLevel level;
  Functions *gl;
  Vec4 *color_local;
  GLint textureName_local;
  GLint bindingPoint_local;
  SamplerBindingRenderCase *this_local;
  
  pRVar3 = gles31::Context::getRenderContext
                     ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  level.m_data.m_cap = CONCAT44(extraout_var,iVar1);
  (**(code **)(level.m_data.m_cap + 8))(bindingPoint + 0x84c0);
  (**(code **)(level.m_data.m_cap + 0xb8))(this->m_textureType,textureName);
  (**(code **)(level.m_data.m_cap + 0x1360))(this->m_textureType,0x2801,0x2601);
  if (this->m_textureType == 0xde1) {
    tcu::TextureFormat::TextureFormat(&local_58,RGBA,UNORM_INT8);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_50,&local_58,1,1,1);
    tcu::TextureLevel::getAccess(&local_80,(TextureLevel *)local_50);
    tcu::clear(&local_80,color);
    pRVar3 = gles31::Context::getRenderContext
                       ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
    dVar2 = this->m_textureType;
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&level_1.m_data.m_cap,(TextureLevel *)local_50);
    glu::texImage2D(pRVar3,dVar2,0,0x8058,(ConstPixelBufferAccess *)&level_1.m_data.m_cap);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_50);
  }
  else if (this->m_textureType == 0x806f) {
    tcu::TextureFormat::TextureFormat(&local_e8,RGBA,UNORM_INT8);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_e0,&local_e8,1,1,1);
    tcu::TextureLevel::getAccess(&local_110,(TextureLevel *)local_e0);
    tcu::clear(&local_110,color);
    pRVar3 = gles31::Context::getRenderContext
                       ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
    dVar2 = this->m_textureType;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_138,(TextureLevel *)local_e0);
    glu::texImage3D(pRVar3,dVar2,0,0x8058,&local_138);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_e0);
  }
  dVar2 = (**(code **)(level.m_data.m_cap + 0x800))();
  glu::checkError(dVar2,"Texture initialization failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x4a2);
  return;
}

Assistant:

void SamplerBindingRenderCase::initializeTexture (glw::GLint bindingPoint, glw::GLint textureName, const Vec4& color) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.activeTexture(GL_TEXTURE0 + bindingPoint);
	gl.bindTexture(m_textureType, textureName);
	gl.texParameteri(m_textureType, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

	switch (m_textureType)
	{
		case GL_TEXTURE_2D:
		{
			tcu::TextureLevel level(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE);
			tcu::clear(level.getAccess(), color);
			glu::texImage2D(m_context.getRenderContext(), m_textureType, 0, GL_RGBA8, level.getAccess());
			break;
		}

		case GL_TEXTURE_3D:
		{
			tcu::TextureLevel level(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE);
			tcu::clear(level.getAccess(), color);
			glu::texImage3D(m_context.getRenderContext(), m_textureType, 0, GL_RGBA8, level.getAccess());
			break;
		}

		default:
			DE_ASSERT(false);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture initialization failed");
}